

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68k-dis.c
# Opt level: O1

int print_insn_arg(char *d,uchar *buffer,uchar *p0,bfd_vma addr,disassemble_info *info)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  int iVar4;
  uint uVar5;
  undefined1 *puVar6;
  char **ppcVar7;
  long lVar8;
  fprintf_ftype p_Var9;
  ulong uVar10;
  int code;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  bfd_vma bVar14;
  FILE *pFVar15;
  uint uVar16;
  byte *pbVar17;
  long lVar18;
  uint uVar19;
  bfd_byte *pbVar20;
  bool bVar21;
  double flval;
  
  bVar1 = *d;
  iVar4 = -2;
  uVar13 = bVar1 - 0x21;
  if (0x5d < uVar13) {
    return -2;
  }
  bVar2 = d[1];
  code = (int)(char)bVar2;
  pbVar20 = p0;
  switch(uVar13) {
  default:
    if (bVar2 == 100) {
      uVar19 = *buffer >> 1 & 7 | (ushort)(CONCAT11(*buffer,buffer[1]) >> 3) & 0x38;
    }
    else {
      uVar19 = buffer[1] & 0x3f;
    }
    switch(bVar1) {
    case 0x62:
      uVar13 = 0x23d;
      break;
    case 99:
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x78:
    case 0x7b:
    case 0x7d:
switchD_0012d317_caseD_63:
      abort();
    case 0x6d:
      uVar13 = 0x1f;
      break;
    case 0x6e:
      uVar13 = 0x220;
      break;
    case 0x6f:
      uVar13 = 0xdc0;
      break;
    case 0x70:
      uVar13 = 0x3f;
      break;
    case 0x71:
      uVar13 = 0x3d;
      break;
    case 0x76:
      uVar13 = 0x1bd;
      break;
    case 0x77:
      uVar13 = 0x23c;
      break;
    case 0x79:
      uVar13 = 0x24;
      break;
    case 0x7a:
      uVar13 = 0x224;
      break;
    case 0x7c:
switchD_0012d317_caseD_7c:
      uVar13 = 0x7e4;
      break;
    case 0x7e:
      uVar13 = 0x1fc;
      break;
    default:
      switch(uVar13) {
      case 0:
        goto switchD_0012d317_caseD_7c;
      case 1:
      case 2:
      case 6:
      case 7:
      case 8:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
        goto switchD_0012d317_caseD_63;
      case 3:
        uVar13 = 0x1fd;
        break;
      case 4:
        uVar13 = 0x1ff;
        break;
      case 5:
        uVar13 = 0x1e4;
        break;
      case 9:
        uVar13 = 0xfff;
        break;
      case 0xe:
        uVar13 = 0x7e5;
        break;
      default:
        switch(bVar1) {
        case 0x34:
          uVar13 = 0x3c;
          break;
        default:
          goto switchD_0012d317_caseD_63;
        case 0x3b:
          uVar13 = 0xffd;
          break;
        case 0x3c:
          uVar13 = 0x7ec;
          break;
        case 0x3e:
          uVar13 = 500;
          break;
        case 0x3f:
          uVar13 = 0x1e5;
          break;
        case 0x40:
          uVar13 = 0x7fd;
        }
      }
    }
    uVar5 = uVar19 >> 3;
    uVar16 = (uVar19 & 7) + 7;
    if (uVar5 != 7) {
      uVar16 = uVar5;
    }
    if ((uVar13 >> uVar16 & 1) == 0) {
      return -1;
    }
    iVar4 = (*(code *)(&DAT_0046fbf4 + *(int *)(&DAT_0046fbf4 + (ulong)uVar5 * 4)))
                      ((uVar19 & 7) + 8,&DAT_0046fbf4,
                       &DAT_0046fbf4 + *(int *)(&DAT_0046fbf4 + (ulong)uVar5 * 4));
    return iVar4;
  case 1:
  case 6:
  case 7:
  case 8:
  case 0xb:
  case 0xd:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1c:
  case 0x2d:
  case 0x2f:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3f:
  case 0x47:
  case 0x5a:
  case 0x5c:
    goto switchD_0012d2cb_caseD_1;
  case 2:
  case 0x3d:
    bVar21 = bVar1 != 0x23;
    if (bVar2 < 0x43) {
      if (bVar2 == 0x33) {
        uVar13 = fetch_arg(buffer,0x33,8,info);
        uVar10 = (ulong)uVar13;
        goto joined_r0x0012e07c;
      }
      if (bVar2 == 0x38) {
        if ((*info->private_data < buffer + 3) && (iVar4 = fetch_data(info,buffer + 3), iVar4 == 0))
        goto LAB_0012e4c3;
        uVar10 = (ulong)(buffer[2] >> 2 & 7);
        goto LAB_0012e4c8;
      }
LAB_0012e087:
      if ((bVar2 & 0xdf) == 0x57) {
        if ((*info->private_data < buffer + (ulong)bVar21 * 2 + 4) &&
           (iVar4 = fetch_data(info,buffer + (ulong)bVar21 * 2 + 4), iVar4 == 0)) break;
        uVar10 = (ulong)(uint)((int)((uint)buffer[(ulong)bVar21 * 2 + 3] << 0x10 |
                                    (uint)(byte)*(uint *)(buffer + (ulong)bVar21 * 2 + 2) << 0x18)
                              >> 0x10);
      }
      else {
        if (bVar2 != 0x6c) {
          return -2;
        }
        if ((*info->private_data < buffer + (ulong)bVar21 * 2 + 6) &&
           (iVar4 = fetch_data(info,buffer + (ulong)bVar21 * 2 + 6), iVar4 == 0)) break;
        uVar13 = *(uint *)(buffer + (ulong)bVar21 * 2 + 2);
        uVar10 = (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                        uVar13 << 0x18);
      }
    }
    else {
      if (bVar2 != 0x43) {
        if (bVar2 == 0x62) {
          if ((*info->private_data < buffer + (ulong)bVar21 * 2 + 4) &&
             (iVar4 = fetch_data(info,buffer + (ulong)bVar21 * 2 + 4), iVar4 == 0)) break;
          uVar10 = (ulong)(uint)(int)(char)buffer[(ulong)bVar21 * 2 + 3];
        }
        else {
          if (bVar2 != 0x73) goto LAB_0012e087;
          uVar10 = (ulong)(buffer[1] & 0xf);
        }
        goto LAB_0012e4cf;
      }
      pbVar17 = buffer + 3;
      if ((*info->private_data < pbVar17) && (iVar4 = fetch_data(info,pbVar17), iVar4 == 0)) {
LAB_0012e4c3:
        uVar10 = 0xffffffff;
      }
      else {
        uVar10 = (ulong)(*pbVar17 & 0x7f);
      }
LAB_0012e4c8:
      uVar13 = (uint)uVar10;
joined_r0x0012e07c:
      if ((int)uVar13 < 0) break;
    }
LAB_0012e4cf:
    pFVar15 = info->stream;
    pcVar12 = "#%d";
    goto LAB_0012e4da;
  case 10:
    uVar13 = fetch_arg(buffer,code,3,info);
    if ((int)uVar13 < 0) break;
    pFVar15 = info->stream;
    pcVar12 = reg_names[(ulong)uVar13 + 8];
    pcVar11 = "(%s)+";
    goto LAB_0012e002;
  case 0xc:
    uVar13 = fetch_arg(buffer,code,3,info);
    if (-1 < (int)uVar13) {
      pFVar15 = info->stream;
      pcVar12 = reg_names[(ulong)uVar13 + 8];
      pcVar11 = "-(%s)";
      goto LAB_0012e002;
    }
    break;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x36:
  case 0x38:
  case 0x39:
    goto switchD_0012d2cb_caseD_f;
  case 0x20:
    uVar13 = fetch_arg(buffer,code,3,info);
    if ((int)uVar13 < 0) break;
    pFVar15 = info->stream;
    pcVar12 = reg_names[(ulong)uVar13 + 8];
    goto LAB_0012de88;
  case 0x21:
    if (bVar2 == 0x42) {
      uVar13 = (uint)(char)buffer[1];
    }
    else if (bVar2 == 0x62) {
      pbVar20 = p0 + 2;
      if ((*info->private_data < pbVar20) && (iVar4 = fetch_data(info,pbVar20), iVar4 == 0)) break;
      uVar13 = (uint)(char)p0[1];
    }
    else {
      if ((bVar2 & 0xdf) != 0x57) {
        if (bVar2 < 99) {
          if ((bVar2 != 0x43) && (bVar2 != 0x4c)) {
            return -2;
          }
LAB_0012e578:
          pbVar20 = p0 + 4;
          if ((pbVar20 <= *info->private_data) || (iVar4 = fetch_data(info,pbVar20), iVar4 != 0)) {
            uVar13 = *(uint *)p0;
            uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                     uVar13 << 0x18;
            goto LAB_0012e59b;
          }
        }
        else if (bVar2 == 99) {
          if ((buffer[1] & 0x40) == 0) {
            if (*info->private_data < p0 + 2) goto LAB_0012e0f0;
            goto LAB_0012e107;
          }
          pbVar20 = p0 + 4;
          if ((pbVar20 <= *info->private_data) || (iVar4 = fetch_data(info,pbVar20), iVar4 != 0)) {
            uVar13 = *(uint *)p0;
            uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                     uVar13 << 0x18;
            goto LAB_0012e59b;
          }
        }
        else {
          if (bVar2 != 0x67) {
            if (bVar2 != 0x6c) {
              return -2;
            }
            goto LAB_0012e578;
          }
          if ((buffer + 2 <= *info->private_data) ||
             (iVar4 = fetch_data(info,buffer + 2), iVar4 != 0)) {
            uVar3 = buffer[1];
            uVar13 = (uint)(char)uVar3;
            if (uVar3 == '\0') {
              pbVar20 = p0 + 2;
              if ((*info->private_data < pbVar20) && (iVar4 = fetch_data(info,pbVar20), iVar4 == 0))
              break;
              uVar13 = (int)((uint)p0[1] << 0x10 | (uint)*p0 << 0x18) >> 0x10;
            }
            else if (uVar3 == 0xff) goto LAB_0012e578;
            goto LAB_0012e59b;
          }
        }
        break;
      }
      if (*info->private_data < p0 + 2) {
LAB_0012e0f0:
        iVar4 = fetch_data(info,p0 + 2);
        if (iVar4 == 0) break;
      }
LAB_0012e107:
      uVar13 = (int)((uint)p0[1] << 0x10 | (uint)*p0 << 0x18) >> 0x10;
      pbVar20 = p0 + 2;
    }
LAB_0012e59b:
    bVar14 = uVar13 + addr;
LAB_0012e59d:
    info->target = bVar14;
    (*info->print_address_func)(bVar14,info);
    goto LAB_0012e4e2;
  case 0x22:
    pFVar15 = info->stream;
    pcVar12 = "ccr";
    goto LAB_0012d973;
  case 0x23:
    iVar4 = 3;
    goto LAB_0012d987;
  case 0x24:
    pFVar15 = info->stream;
    pcVar12 = "acc";
    goto LAB_0012d973;
  case 0x25:
    uVar13 = fetch_arg(buffer,code,3,info);
    if ((int)uVar13 < 0) break;
    pFVar15 = info->stream;
    pcVar12 = "fp%d";
    goto LAB_0012dac8;
  case 0x26:
    pFVar15 = info->stream;
    pcVar12 = "macsr";
    goto LAB_0012d973;
  case 0x27:
    pFVar15 = info->stream;
    pcVar12 = "mask";
    goto LAB_0012d973;
  case 0x28:
    uVar13 = *buffer >> 1 & 7;
    uVar10 = (ulong)uVar13;
    if (uVar13 == 1) goto LAB_0012e4e2;
    pFVar15 = info->stream;
    pcVar12 = "(cpid=%d) ";
    goto LAB_0012e4da;
  case 0x29:
    uVar13 = (uint)info->mach;
    uVar19 = fetch_arg(buffer,code,0xc,info);
    if ((int)uVar19 < 0) {
      bVar21 = true;
    }
    else if (uVar13 < 0x11 || (uVar13 & 0xffffffe0) != 0) {
LAB_0012d50e:
      uVar10 = 0xf;
      do {
        iVar4 = (int)uVar10;
        if (print_insn_arg::names[uVar10].value == uVar19) {
          bVar21 = false;
          (*info->fprintf_func)(info->stream,"%s",print_insn_arg::names[uVar10].name);
          if (-1 < iVar4) goto joined_r0x0012e517;
          break;
        }
        uVar10 = (ulong)(iVar4 - 1);
      } while (iVar4 != 0);
      bVar21 = false;
      (*info->fprintf_func)(info->stream,"%d",(ulong)uVar19);
    }
    else {
      lVar18 = 0x58;
      do {
        lVar8 = lVar18;
        if (lVar8 + -0x10 == -0x18) goto LAB_0012d50e;
        lVar18 = lVar8 + -0x10;
      } while (*(uint *)((long)&print_insn_arg::names_v4e[0].name + lVar8) != uVar19);
      (*info->fprintf_func)
                (info->stream,"%s",*(undefined8 *)((long)&print_insn_arg::names[0xf].value + lVar8))
      ;
      bVar21 = false;
    }
    goto joined_r0x0012e517;
  case 0x2a:
    iVar4 = 9;
    goto LAB_0012d5cd;
  case 0x2b:
  case 0x4b:
    if (bVar2 == 0x33) {
      uVar13 = fetch_arg(buffer,0x33,8,info);
      if ((int)uVar13 < 0) {
        bVar21 = true;
      }
      else if (uVar13 == 0) {
        (*info->fprintf_func)(info->stream,"#0");
        bVar21 = false;
      }
      else {
        uVar19 = uVar13;
        if (*d == 'l') {
          uVar19 = 0;
          iVar4 = 0;
          do {
            uVar16 = 1 << ((byte)iVar4 & 0x1f);
            if (-1 < (char)(uVar13 << ((byte)iVar4 & 0x1f))) {
              uVar16 = 0;
            }
            uVar19 = uVar19 | uVar16;
            iVar4 = iVar4 + 1;
          } while (iVar4 != 8);
        }
        bVar21 = false;
        uVar13 = 0;
        do {
          uVar16 = uVar13;
          if (((uVar19 & 0xff) >> (uVar13 & 0x1f) & 1) != 0) {
            if (bVar21) {
              (*info->fprintf_func)(info->stream,"/");
            }
            (*info->fprintf_func)(info->stream,"fp%d",(ulong)uVar13);
            uVar16 = uVar13 - 1;
            do {
              uVar5 = uVar16 + 2;
              uVar16 = uVar16 + 1;
            } while (((uVar19 & 0xff) >> (uVar5 & 0x1f) & 1) != 0);
            bVar21 = true;
            if ((int)uVar13 < (int)uVar16) {
              (*info->fprintf_func)(info->stream,"-fp%d",(ulong)uVar16);
            }
          }
          uVar13 = uVar16 + 1;
        } while ((int)uVar16 < 7);
        bVar21 = false;
      }
    }
    else {
      if (bVar2 == 0x38) {
        if ((*info->private_data < buffer + 3) && (iVar4 = fetch_data(info,buffer + 3), iVar4 == 0))
        {
          uVar13 = 0xffffffff;
        }
        else {
          uVar13 = buffer[2] >> 2 & 7;
        }
        goto LAB_0012de6f;
      }
      if (bVar2 != 0x77) {
        return -2;
      }
      pbVar20 = buffer + 4;
      if ((*info->private_data < pbVar20) && (iVar4 = fetch_data(info,pbVar20), iVar4 == 0)) {
        bVar21 = true;
        pbVar20 = p0;
      }
      else {
        uVar13 = (uint)buffer[3] << 0x10 | (uint)buffer[2] << 0x18;
        if (pbVar20 <= p0) {
          pbVar20 = p0;
        }
        if (uVar13 == 0) {
          (*info->fprintf_func)(info->stream,"#0");
          bVar21 = false;
        }
        else {
          uVar13 = (int)uVar13 >> 0x10;
          uVar19 = uVar13;
          if (*d == 'l') {
            uVar19 = 0;
            iVar4 = 0;
            do {
              uVar16 = 1 << ((byte)iVar4 & 0x1f);
              if (-1 < (short)(uVar13 << ((byte)iVar4 & 0x1f))) {
                uVar16 = 0;
              }
              uVar19 = uVar19 | uVar16;
              iVar4 = iVar4 + 1;
            } while (iVar4 != 0x10);
          }
          bVar21 = false;
          uVar13 = 0;
          do {
            uVar16 = uVar13;
            if (((uVar19 & 0xffff) >> (uVar13 & 0x1f) & 1) != 0) {
              if (bVar21) {
                (*info->fprintf_func)(info->stream,"/");
              }
              (*info->fprintf_func)(info->stream,"%s",reg_names[(int)uVar13]);
              lVar18 = (long)(int)uVar13 + -1;
              do {
                uVar16 = uVar16 + 1;
                lVar18 = lVar18 + 1;
              } while (((uVar19 & 0xffff) >> (uVar16 & 0x1f) & 1) != 0);
              uVar16 = (uint)lVar18;
              if ((int)uVar13 < (int)uVar16) {
                (*info->fprintf_func)(info->stream,"-%s",reg_names[lVar18]);
              }
              bVar21 = true;
            }
            uVar13 = uVar16 + 1;
          } while ((int)uVar16 < 0xf);
          bVar21 = false;
        }
      }
    }
joined_r0x0012e517:
    if (!bVar21) goto LAB_0012e4e2;
    break;
  case 0x2c:
    if (bVar2 == 0x68) {
      pFVar15 = info->stream;
      puVar6 = (undefined1 *)&print_insn_arg_scalefactor_name_rel;
      iVar4 = *(int *)((long)&print_insn_arg_scalefactor_name_rel + (ulong)(buffer[2] & 4));
LAB_0012da8c:
      pcVar12 = (char *)((long)iVar4 + (long)puVar6);
      goto LAB_0012de88;
    }
    uVar13 = fetch_arg(buffer,code,8,info);
    if (-1 < (int)uVar13) {
      uVar19 = uVar13 - 0x100;
      if (-1 < (char)uVar13) {
        uVar19 = uVar13;
      }
      uVar10 = (ulong)uVar19;
      goto LAB_0012e4cf;
    }
    break;
  case 0x2e:
    uVar13 = fetch_arg(buffer,code,6,info);
    if (-1 < (int)uVar13) {
      pFVar15 = info->stream;
      p_Var9 = info->fprintf_func;
      if ((uVar13 & 0x20) != 0) {
        (*p_Var9)(pFVar15,"%s",reg_names[uVar13 & 7]);
        goto LAB_0012e4e2;
      }
      pcVar12 = "%d";
LAB_0012e356:
      (*p_Var9)(pFVar15,pcVar12,(ulong)uVar13);
      goto LAB_0012e4e2;
    }
    break;
  case 0x30:
    uVar13 = fetch_arg(buffer,code,3,info);
    if ((int)uVar13 < 0) break;
    if (uVar13 == 0) {
      uVar13 = (uint)(d[1] != 's') << 3;
    }
    goto LAB_0012dabd;
  case 0x31:
    iVar4 = 4;
LAB_0012d987:
    uVar13 = fetch_arg(buffer,code,iVar4,info);
    if ((int)uVar13 < 0) break;
    pFVar15 = info->stream;
    ppcVar7 = reg_names;
LAB_0012de84:
    pcVar12 = ppcVar7[uVar13];
LAB_0012de88:
    pcVar11 = "%s";
    goto LAB_0012e002;
  case 0x32:
    pFVar15 = info->stream;
    pcVar12 = "sr";
    goto LAB_0012d973;
  case 0x33:
    iVar4 = 4;
LAB_0012d5cd:
    uVar13 = fetch_arg(buffer,code,iVar4,info);
    if ((int)uVar13 < 0) break;
LAB_0012dabd:
    pFVar15 = info->stream;
LAB_0012dac1:
    pcVar12 = "#%d";
LAB_0012dac8:
    uVar10 = (ulong)uVar13;
LAB_0012e4da:
    (*info->fprintf_func)(pFVar15,pcVar12,uVar10);
    goto LAB_0012e4e2;
  case 0x34:
    pFVar15 = info->stream;
    pcVar12 = "usp";
    goto LAB_0012d973;
  case 0x35:
    pFVar15 = info->stream;
    pcVar12 = "val";
LAB_0012d973:
    (*info->fprintf_func)(pFVar15,pcVar12);
LAB_0012e4e2:
    return (int)pbVar20 - (int)p0;
  case 0x37:
    code = 0x38;
switchD_0012d2cb_caseD_f:
    uVar13 = fetch_arg(buffer,code,5,info);
    if ((int)uVar13 < 0) break;
    switch(uVar13) {
    case 2:
      pcVar12 = "tt0";
      break;
    case 3:
      pcVar12 = "tt1";
      break;
    default:
      pFVar15 = info->stream;
      pcVar11 = "<mmu register %d>";
      uVar19 = uVar13;
      goto LAB_0012e178;
    case 0x10:
      pcVar12 = "tc";
      break;
    case 0x11:
      pcVar12 = "drp";
      break;
    case 0x12:
      pcVar12 = "srp";
      break;
    case 0x13:
      pcVar12 = "crp";
      break;
    case 0x14:
      pcVar12 = "cal";
      break;
    case 0x15:
      pcVar12 = "val";
      break;
    case 0x16:
      pcVar12 = "scc";
      break;
    case 0x17:
      pcVar12 = "ac";
      break;
    case 0x18:
      pcVar12 = "psr";
      break;
    case 0x19:
      pcVar12 = "pcsr";
      break;
    case 0x1c:
    case 0x1d:
      uVar19 = buffer[3] >> 2 & 7;
      pFVar15 = info->stream;
      pcVar11 = "bac%d";
      if (uVar13 == 0x1c) {
        pcVar11 = "bad%d";
      }
LAB_0012e178:
      pcVar12 = (char *)0x0;
      (*info->fprintf_func)(pFVar15,pcVar11,(ulong)uVar19);
      bVar21 = true;
      goto LAB_0012dfe9;
    }
    bVar21 = false;
LAB_0012dfe9:
    if (!bVar21) {
      pFVar15 = info->stream;
      pcVar11 = "%s";
LAB_0012e002:
      (*info->fprintf_func)(pFVar15,pcVar11,pcVar12);
    }
    goto LAB_0012e4e2;
  case 0x3e:
    pbVar20 = p0 + 4;
    if ((pbVar20 <= *info->private_data) || (iVar4 = fetch_data(info,pbVar20), iVar4 != 0)) {
      uVar13 = *(uint *)p0;
      bVar14 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      goto LAB_0012e59d;
    }
    break;
  case 0x40:
    uVar13 = fetch_arg(buffer,code,3,info);
    if (-1 < (int)uVar13) {
      pFVar15 = info->stream;
      pcVar12 = reg_names[(ulong)uVar13 + 8];
LAB_0012d92a:
      pcVar11 = "(%s)";
      goto LAB_0012e002;
    }
    break;
  case 0x42:
    uVar13 = fetch_arg(buffer,code,2,info);
    if (-1 < (int)uVar13) {
      pFVar15 = info->stream;
      puVar6 = print_insn_arg_cacheFieldName_rel;
      iVar4 = *(int *)(print_insn_arg_cacheFieldName_rel + (ulong)uVar13 * 4);
      goto LAB_0012da8c;
    }
    break;
  case 0x43:
    pbVar20 = p0 + 2;
    if ((pbVar20 <= *info->private_data) || (iVar4 = fetch_data(info,pbVar20), iVar4 != 0)) {
      bVar1 = *p0;
      bVar2 = p0[1];
      uVar13 = fetch_arg(buffer,code,3,info);
      if (-1 < (int)uVar13) {
        (*info->fprintf_func)
                  (info->stream,"%d(%s)",
                   (ulong)(uint)((int)((uint)bVar2 << 0x10 | (uint)bVar1 << 0x18) >> 0x10),
                   reg_names[(ulong)uVar13 + 8]);
        goto LAB_0012e4e2;
      }
    }
    break;
  case 0x44:
    uVar13 = fetch_arg(buffer,code,2,info);
    if (-1 < (int)uVar13) {
      pFVar15 = info->stream;
      pcVar12 = "%%acc%d";
      goto LAB_0012dac8;
    }
    break;
  case 0x45:
    uVar13 = fetch_arg(buffer,code,5,info);
    if (-1 < (int)uVar13) {
      pFVar15 = info->stream;
      p_Var9 = info->fprintf_func;
      if (uVar13 == 0) {
        pcVar12 = "sfc";
      }
      else {
        if (uVar13 != 1) {
          pcVar12 = "<function code %d>";
          goto LAB_0012e356;
        }
        pcVar12 = "dfc";
      }
      (*p_Var9)(pFVar15,pcVar12);
      goto LAB_0012e4e2;
    }
    break;
  case 0x46:
    iVar4 = fetch_arg(buffer,code,1,info);
    if (-1 < iVar4) {
      pFVar15 = info->stream;
      pcVar12 = "23";
      if (iVar4 == 0) {
        pcVar12 = "01";
      }
      pcVar11 = "%%accext%s";
      goto LAB_0012e002;
    }
    break;
  case 0x48:
    iVar4 = fetch_arg(buffer,code,2,info);
    if (-1 < iVar4) {
      if (iVar4 == 3) {
        pFVar15 = info->stream;
        pcVar12 = ">>";
      }
      else {
        if (iVar4 != 1) {
          return -1;
        }
        pFVar15 = info->stream;
        pcVar12 = "<<";
      }
      goto LAB_0012d973;
    }
    break;
  case 0x49:
    iVar4 = fetch_arg(buffer,code,3,info);
    if (iVar4 < 0) break;
    pFVar15 = info->stream;
    uVar13 = iVar4 + 1;
    goto LAB_0012dac1;
  case 0x4a:
    if (bVar2 == 0x43) {
      pbVar17 = buffer + 3;
      if ((*info->private_data < pbVar17) && (iVar4 = fetch_data(info,pbVar17), iVar4 == 0)) {
        uVar13 = 0xffffffff;
      }
      else {
        uVar13 = *pbVar17 & 0x7f;
      }
      if (-1 < (int)uVar13) {
        uVar19 = uVar13 - 0x80;
        if ((int)uVar13 < 0x40) {
          uVar19 = uVar13;
        }
        uVar10 = (ulong)uVar19;
        pFVar15 = info->stream;
        pcVar12 = "{#%d}";
        goto LAB_0012e4da;
      }
    }
    else {
      if (bVar2 != 0x6b) {
        return -1;
      }
      pbVar17 = buffer + 3;
      if ((*info->private_data < pbVar17) && (iVar4 = fetch_data(info,pbVar17), iVar4 == 0)) {
        uVar13 = 0xffffffff;
      }
      else {
        uVar13 = *pbVar17 >> 4 & 7;
      }
      if (-1 < (int)uVar13) {
        pFVar15 = info->stream;
        pcVar12 = reg_names[uVar13];
        pcVar11 = "{%s}";
        goto LAB_0012e002;
      }
    }
    break;
  case 0x51:
    uVar13 = fetch_arg(buffer,code,4,info);
    if (-1 < (int)uVar13) {
      pFVar15 = info->stream;
      pcVar12 = reg_names[uVar13];
      goto LAB_0012d92a;
    }
    break;
  case 0x52:
    uVar13 = fetch_arg(buffer,code,3,info);
LAB_0012de6f:
    if ((int)uVar13 < 0) break;
    pFVar15 = info->stream;
    ppcVar7 = fpcr_names;
    goto LAB_0012de84;
  case 0x53:
    uVar13 = fetch_arg(buffer,code,3,info);
    if (-1 < (int)uVar13) {
      pFVar15 = info->stream;
      pcVar12 = "%d";
      goto LAB_0012dac8;
    }
    break;
  case 0x54:
    uVar13 = fetch_arg(buffer,code,5,info);
    if (-1 < (int)uVar13) {
      pcVar12 = "u";
      uVar19 = uVar13 & 0xf;
      if ((uVar13 & 0x10) == 0) {
        pcVar12 = "l";
        uVar19 = uVar13;
      }
      (*info->fprintf_func)
                (info->stream,"%s%s",
                 reg_half_names_rel + *(int *)(reg_half_names_rel + (ulong)uVar19 * 4),pcVar12);
      goto LAB_0012e4e2;
    }
    break;
  case 0x57:
    uVar13 = fetch_arg(buffer,code,3,info);
    if (-1 < (int)uVar13) {
      uVar10 = (ulong)(-(uint)(uVar13 == 0) | uVar13);
      goto LAB_0012e4cf;
    }
  }
  iVar4 = -3;
switchD_0012d2cb_caseD_1:
  return iVar4;
}

Assistant:

static int
print_insn_arg (const char *d,
		unsigned char *buffer,
		unsigned char *p0,
		bfd_vma addr,
		disassemble_info *info)
{
  int val = 0;
  int place = d[1];
  unsigned char *p = p0;
  int regno;
  const char *regname;
  unsigned char *p1;
  double flval;
  int flt_p;
  bfd_signed_vma disp;
  unsigned int uval;

  switch (*d)
    {
    case 'c':		/* Cache identifier.  */
      {
        static char *const cacheFieldName[] = { "nc", "dc", "ic", "bc" };
        FETCH_ARG (2, val);
	(*info->fprintf_func) (info->stream, "%s", cacheFieldName[val]);
        break;
      }

    case 'a':		/* Address register indirect only. Cf. case '+'.  */
      {
	FETCH_ARG (3, val);
#ifdef MOTOROLA
	(*info->fprintf_func) (info->stream, "(%s)", reg_names[val + 8]);
#else
	(*info->fprintf_func) (info->stream, "%s@", reg_names[val + 8]);
#endif
        break;
      }

    case '_':		/* 32-bit absolute address for move16.  */
      {
        NEXTULONG (p, uval);
        info->target = uval;
	(*info->print_address_func) (uval, info);
        break;
      }

    case 'C':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "ccr");
#else
      (*info->fprintf_func) (info->stream, "%%ccr");
#endif
      break;

    case 'S':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "sr");
#else
      (*info->fprintf_func) (info->stream, "%%sr");
#endif
      break;

    case 'U':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "usp");
#else
      (*info->fprintf_func) (info->stream, "%%usp");
#endif
      break;

    case 'E':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "acc");
#else
      (*info->fprintf_func) (info->stream, "%%acc");
#endif
      break;

    case 'G':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "macsr");
#else
      (*info->fprintf_func) (info->stream, "%%macsr");
#endif
      break;

    case 'H':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "mask");
#else
      (*info->fprintf_func) (info->stream, "%%mask");
#endif
      break;

    case 'J':
      {
	/* FIXME: There's a problem here, different m68k processors call the
	   same address different names.  The tables below try to get it right
	   using info->mach, but only for v4e.  */
	struct regname { char * name; int value; };
#ifdef MOTOROLA
	static const struct regname names[] =
	  {
          {"sfc", 0x000},
          {"dfc", 0x001},
          {"cacr", 0x002},
          {"tc",  0x003},
          {"itt0",0x004},
          {"itt1", 0x005},
          {"dtt0",0x006},
          {"dtt1",0x007},
          // {"buscr",0x008},
          // {"rgpiobar", 0x009},
          // {"acr4",0x00c},
          // {"acr5",0x00d},
          // {"acr6",0x00e},
          // {"acr7", 0x00f},
          {"usp", 0x800},
          {"vbr", 0x801},
          {"caar", 0x802},
          {"msp", 0x803},
          {"isp", 0x804},
          // {"pc", 0x80f},
	    /* Reg c04 is sometimes called flashbar or rambar.
	       Reg c05 is also sometimes called rambar.  */
          // {"rambar0", 0xc04},
          // {"rambar1", 0xc05},

	    /* reg c0e is sometimes called mbar2 or secmbar.
	       reg c0f is sometimes called mbar.  */
          // {"mbar0", 0xc0e},
          // {"mbar1", 0xc0f},

	    /* Should we be calling this psr like we do in case 'Y'?  */
          {"mmusr",0x805},

          {"urp", 0x806},
          {"srp", 0x807},
          // {"pcr", 0x808},

	    /* Fido added these.  */
	    // {"cac", 0xffe},
        // {"mbo", 0xfff}
	};
	/* Alternate names for v4e (MCF5407/5445x/MCF547x/MCF548x), at least.  */
	static const struct regname names_v4e[] =
	  {
	    {"asid",0x003}, {"acr0",0x004}, {"acr1",0x005},
	    {"acr2",0x006}, {"acr3",0x007}, {"mmubar",0x008},
	  };
#else
	static const struct regname names[] =
	  {
	    {"%sfc", 0x000},
        {"%dfc", 0x001},
        {"%cacr", 0x002},
	    {"%tc",  0x003},
        {"%itt0",0x004},
        {"%itt1", 0x005},
	    {"%dtt0",0x006},
        {"%dtt1",0x007},
        // {"%buscr",0x008},
	    // {"%rgpiobar", 0x009},
        // {"%acr4",0x00c},
	    // {"%acr5",0x00d},
        // {"%acr6",0x00e},
        // {"%acr7", 0x00f},
	    {"%usp", 0x800},
        {"%vbr", 0x801},
        {"%caar", 0x802},
	    {"%msp", 0x803},
        {"%isp", 0x804},
	    // {"%pc", 0x80f},
	    /* Reg c04 is sometimes called flashbar or rambar.
	       Reg c05 is also sometimes called rambar.  */
	    // {"%rambar0", 0xc04},
        // {"%rambar1", 0xc05},

	    /* reg c0e is sometimes called mbar2 or secmbar.
	       reg c0f is sometimes called mbar.  */
	    // {"%mbar0", 0xc0e},
        // {"%mbar1", 0xc0f},

	    /* Should we be calling this psr like we do in case 'Y'?  */
	    {"%mmusr",0x805},

	    {"%urp", 0x806},
        {"%srp", 0x807},
        // {"%pcr", 0x808},

	    /* Fido added these.  */
	    // {"%cac", 0xffe},
        // {"%mbo", 0xfff}
	};
	/* Alternate names for v4e (MCF5407/5445x/MCF547x/MCF548x), at least.  */
	static const struct regname names_v4e[] =
	  {
	    {"%asid",0x003}, {"%acr0",0x004}, {"%acr1",0x005},
	    {"%acr2",0x006}, {"%acr3",0x007}, {"%mmubar",0x008},
	  };
#endif
	unsigned int arch_mask;

	arch_mask = bfd_m68k_mach_to_features (info->mach);
	FETCH_ARG (12, val);
	if (arch_mask & (mcfisa_b | mcfisa_c))
	  {
	    for (regno = ARRAY_SIZE (names_v4e); --regno >= 0;)
	      if (names_v4e[regno].value == val)
		{
		  (*info->fprintf_func) (info->stream, "%s", names_v4e[regno].name);
		  break;
		}
	    if (regno >= 0)
	      break;
	  }
	for (regno = ARRAY_SIZE (names) - 1; regno >= 0; regno--)
	  if (names[regno].value == val)
	    {
	      (*info->fprintf_func) (info->stream, "%s", names[regno].name);
	      break;
	    }
	if (regno < 0)
	  // (*info->fprintf_func) (info->stream, "0x%x", val); // DIRK: Replaced by...
        (*info->fprintf_func) (info->stream, "%d", val); // DIRK
      }
      break;

    case 'Q':
      FETCH_ARG (3, val);
      /* 0 means 8, except for the bkpt instruction... */
      if (val == 0 && d[1] != 's')
	val = 8;
      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'x':
      FETCH_ARG (3, val);
      /* 0 means -1.  */
      if (val == 0)
	val = -1;
      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'j':
      FETCH_ARG (3, val);
      (*info->fprintf_func) (info->stream, "#%d", val+1);
      break;

    case 'K':
      FETCH_ARG (9, val);
      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'M':
      if (place == 'h')
	{
	  static char *const scalefactor_name[] = { "<<", ">>" };

	  FETCH_ARG (1, val);
	  (*info->fprintf_func) (info->stream, "%s", scalefactor_name[val]);
	}
      else
	{
	  FETCH_ARG (8, val);
	  if (val & 0x80)
	    val = val - 0x100;
	  (*info->fprintf_func) (info->stream, "#%d", val);
	}
      break;

    case 'T':
      FETCH_ARG (4, val);
      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'D':
      FETCH_ARG (3, val);
      (*info->fprintf_func) (info->stream, "%s", reg_names[val]);
      break;

    case 'A':
      FETCH_ARG (3, val);
      (*info->fprintf_func) (info->stream, "%s", reg_names[val + 010]);
      break;

    case 'R':
      FETCH_ARG (4, val);
      (*info->fprintf_func) (info->stream, "%s", reg_names[val]);
      break;

    case 'r':
      FETCH_ARG (4, regno);
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "(%s)", reg_names[regno]);
#else
      if (regno > 7)
	(*info->fprintf_func) (info->stream, "%s@", reg_names[regno]);
      else
	(*info->fprintf_func) (info->stream, "@(%s)", reg_names[regno]);
#endif
      break;

    case 'F':
      FETCH_ARG (3, val);
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "fp%d", val);
#else
      (*info->fprintf_func) (info->stream, "%%fp%d", val);
#endif
      break;

    case 'O':
      FETCH_ARG (6, val);
      if (val & 0x20)
	(*info->fprintf_func) (info->stream, "%s", reg_names[val & 7]);
      else
	(*info->fprintf_func) (info->stream, "%d", val);
      break;

    case '+':
      FETCH_ARG (3, val);
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "(%s)+", reg_names[val + 8]);
#else
      (*info->fprintf_func) (info->stream, "%s@+", reg_names[val + 8]);
#endif
      break;

    case '-':
      FETCH_ARG (3, val);
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "-(%s)", reg_names[val + 8]);
#else
      (*info->fprintf_func) (info->stream, "%s@-", reg_names[val + 8]);
#endif
      break;

    case 'k':
      if (place == 'k')
	{
	  FETCH_ARG (3, val);
	  (*info->fprintf_func) (info->stream, "{%s}", reg_names[val]);
	}
      else if (place == 'C')
	{
	  FETCH_ARG (7, val);
	  if (val > 63)		/* This is a signed constant.  */
	    val -= 128;
	  (*info->fprintf_func) (info->stream, "{#%d}", val);
	}
      else
	return PRINT_INSN_ARG_INVALID_OPERAND;
      break;

    case '#':
    case '^':
      p1 = buffer + (*d == '#' ? 2 : 4);
      if (place == 's')
	FETCH_ARG (4, val);
      else if (place == 'C')
	FETCH_ARG (7, val);
      else if (place == '8')
	FETCH_ARG (3, val);
      else if (place == '3')
	FETCH_ARG (8, val);
      else if (place == 'b')
	NEXTBYTE (p1, val);
      else if (place == 'w' || place == 'W')
	NEXTWORD (p1, val, PRINT_INSN_ARG_MEMORY_ERROR);
      else if (place == 'l')
	NEXTLONG (p1, val, PRINT_INSN_ARG_MEMORY_ERROR);
      else
	return PRINT_INSN_ARG_INVALID_OP_TABLE;

      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'B':
      if (place == 'b')
	NEXTBYTE (p, disp);
      else if (place == 'B')
	disp = COERCE_SIGNED_CHAR (buffer[1]);
      else if (place == 'w' || place == 'W')
	NEXTWORD (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
      else if (place == 'l' || place == 'L' || place == 'C')
	NEXTLONG (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
      else if (place == 'g')
	{
	  NEXTBYTE (buffer, disp);
	  if (disp == 0)
	    NEXTWORD (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
	  else if (disp == -1)
	    NEXTLONG (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
	}
      else if (place == 'c')
	{
	  if (buffer[1] & 0x40)		/* If bit six is one, long offset.  */
	    NEXTLONG (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
	  else
	    NEXTWORD (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
	}
      else
	return PRINT_INSN_ARG_INVALID_OP_TABLE;

      info->target = addr + disp;
      (*info->print_address_func) (addr + disp, info);
      break;

    case 'd':
      {
	int val1;

	NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
	FETCH_ARG (3, val1);
#ifdef MOTOROLA
	(*info->fprintf_func) (info->stream, "%d(%s)", val, reg_names[val1 + 8]);
#else
	(*info->fprintf_func) (info->stream, "%s@(%d)", reg_names[val1 + 8], val);
#endif
	break;
      }

    case 's':
      FETCH_ARG (3, val);
      (*info->fprintf_func) (info->stream, "%s", fpcr_names[val]);
      break;

    case 'e':
      FETCH_ARG (2, val);
      (*info->fprintf_func) (info->stream, "%%acc%d", val);
      break;

    case 'g':
      FETCH_ARG (1, val);
      (*info->fprintf_func) (info->stream, "%%accext%s", val == 0 ? "01" : "23");
      break;

    case 'i':
      FETCH_ARG (2, val);
      if (val == 1)
	(*info->fprintf_func) (info->stream, "<<");
      else if (val == 3)
	(*info->fprintf_func) (info->stream, ">>");
      else
	return PRINT_INSN_ARG_INVALID_OPERAND;
      break;

    case 'I':
      /* Get coprocessor ID... */
      val = fetch_arg (buffer, 'd', 3, info);
      if (val < 0)
	return PRINT_INSN_ARG_MEMORY_ERROR;
      if (val != 1)				/* Unusual coprocessor ID?  */
	(*info->fprintf_func) (info->stream, "(cpid=%d) ", val);
      break;

    case '4':
    case '*':
    case '~':
    case '%':
    case ';':
    case '@':
    case '!':
    case '$':
    case '?':
    case '/':
    case '&':
    case '|':
    case '<':
    case '>':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'v':
    case 'b':
    case 'w':
    case 'y':
    case 'z':
      if (place == 'd')
	{
	  val = fetch_arg (buffer, 'x', 6, info);
	  if (val < 0)
	    return PRINT_INSN_ARG_MEMORY_ERROR;
	  val = ((val & 7) << 3) + ((val >> 3) & 7);
	}
      else
	{
	  val = fetch_arg (buffer, 's', 6, info);
	  if (val < 0)
	    return PRINT_INSN_ARG_MEMORY_ERROR;
	}

      /* If the <ea> is invalid for *d, then reject this match.  */
      if (!m68k_valid_ea (*d, val))
	return PRINT_INSN_ARG_INVALID_OPERAND;

      /* Get register number assuming address register.  */
      regno = (val & 7) + 8;
      regname = reg_names[regno];
      switch (val >> 3)
	{
	case 0:
	  (*info->fprintf_func) (info->stream, "%s", reg_names[val]);
	  break;

	case 1:
	  (*info->fprintf_func) (info->stream, "%s", regname);
	  break;

	case 2:
#ifdef MOTOROLA
	  (*info->fprintf_func) (info->stream, "(%s)", regname);
#else
	  (*info->fprintf_func) (info->stream, "%s@", regname);
#endif
	  break;

	case 3:
#ifdef MOTOROLA
	  (*info->fprintf_func) (info->stream, "(%s)+", regname);
#else
	  (*info->fprintf_func) (info->stream, "%s@+", regname);
#endif
	  break;

	case 4:
#ifdef MOTOROLA
	  (*info->fprintf_func) (info->stream, "-(%s)", regname);
#else
	  (*info->fprintf_func) (info->stream, "%s@-", regname);
#endif
	  break;

	case 5:
	  NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
#ifdef MOTOROLA
	  if (dump_baserel)
	    {
	      (*info->fprintf_func) (info->stream, "(");
	      print_base(regno, val, info);
	      (*info->fprintf_func) (info->stream, ")");
	    }
	  else
	    (*info->fprintf_func) (info->stream, "%d(%s)", val, regname);
#else
	  (*info->fprintf_func) (info->stream, "%s@(%d)", regname, val);
#endif
	  break;

	case 6:
	  p = print_indexed (regno, p, addr, info);
	  if (p == NULL)
	    return PRINT_INSN_ARG_MEMORY_ERROR;
	  break;

	case 7:
	  switch (val & 7)
	    {
	    case 0:
          NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
        info->target = val;
	      (*info->print_address_func) ((unsigned short)val, info); // DIRK: Added (unsigned short)
	      break;

	    case 1:
	      NEXTULONG (p, uval);
        info->target = uval;
	      (*info->print_address_func) (uval, info);
	      break;

	    case 2:
	      NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
        info->target = addr + val;
#ifdef MOTOROLA
	      (*info->print_address_func) (addr + val, info);
	      (*info->fprintf_func) (info->stream, "(pc)");
#else
	      (*info->fprintf_func) (info->stream, "%%pc@(");
	      (*info->print_address_func) (addr + val, info);
	      (*info->fprintf_func) (info->stream, ")");
#endif
	      break;

	    case 3:
	      p = print_indexed (-1, p, addr, info);
	      if (p == NULL)
		return PRINT_INSN_ARG_MEMORY_ERROR;
	      break;

	    case 4:
	      flt_p = 1;	/* Assume it's a float... */
	      switch (place)
	      {
		case 'b':
		  NEXTBYTE (p, val);
		  flt_p = 0;
		  break;

		case 'w':
		  NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
		  flt_p = 0;
		  break;

		case 'l':
		  NEXTLONG (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
		  flt_p = 0;
		  break;

		case 'f':
		  NEXTSINGLE (flval, p);
		  break;

		case 'F':
		  NEXTDOUBLE (flval, p);
		  break;

		case 'x':
		  NEXTEXTEND (flval, p);
		  break;

		case 'p':
		  NEXTPACKED (p, flval);
		  break;

		default:
		  return PRINT_INSN_ARG_INVALID_OPERAND;
	      }
	      if (flt_p)	/* Print a float? */
              (*info->fprintf_func) (info->stream, "#<fixme>"); //  "#0e%g", flval);  // DIRK: REMOVE ASAP
	      else
		(*info->fprintf_func) (info->stream, "#%d", val);
	      break;

	    default:
	      return PRINT_INSN_ARG_INVALID_OPERAND;
	    }
	}

      /* If place is '/', then this is the case of the mask bit for
	 mac/emac loads. Now that the arg has been printed, grab the
	 mask bit and if set, add a '&' to the arg.  */
      if (place == '/')
	{
	  FETCH_ARG (1, val);
	  if (val)
	    info->fprintf_func (info->stream, "&");
	}
      break;

    case 'L':
    case 'l':
	if (place == 'w')
	  {
	    char doneany;
	    p1 = buffer + 2;
	    NEXTWORD (p1, val, PRINT_INSN_ARG_MEMORY_ERROR);
	    /* Move the pointer ahead if this point is farther ahead
	       than the last.  */
	    p = p1 > p ? p1 : p;
	    if (val == 0)
	      {
		(*info->fprintf_func) (info->stream, "#0");
		break;
	      }
	    if (*d == 'l')
	      {
		int newval = 0;

		for (regno = 0; regno < 16; ++regno)
		  if (val & (0x8000 >> regno))
		    newval |= 1 << regno;
		val = newval;
	      }
	    val &= 0xffff;
	    doneany = 0;
	    for (regno = 0; regno < 16; ++regno)
	      if (val & (1 << regno))
		{
		  int first_regno;

		  if (doneany)
		    (*info->fprintf_func) (info->stream, "/");
		  doneany = 1;
		  (*info->fprintf_func) (info->stream, "%s", reg_names[regno]);
		  first_regno = regno;
		  while (val & (1 << (regno + 1)))
		    ++regno;
		  if (regno > first_regno)
		    (*info->fprintf_func) (info->stream, "-%s",
					   reg_names[regno]);
		}
	  }
	else if (place == '3')
	  {
	    /* `fmovem' insn.  */
	    char doneany;

	    FETCH_ARG (8, val);
	    if (val == 0)
	      {
		(*info->fprintf_func) (info->stream, "#0");
		break;
	      }
	    if (*d == 'l')
	      {
		int newval = 0;

		for (regno = 0; regno < 8; ++regno)
		  if (val & (0x80 >> regno))
		    newval |= 1 << regno;
		val = newval;
	      }
	    val &= 0xff;
	    doneany = 0;
	    for (regno = 0; regno < 8; ++regno)
	      if (val & (1 << regno))
		{
		  int first_regno;
		  if (doneany)
		    (*info->fprintf_func) (info->stream, "/");
		  doneany = 1;
#ifdef MOTOROLA
		  (*info->fprintf_func) (info->stream, "fp%d", regno);
#else
		  (*info->fprintf_func) (info->stream, "%%fp%d", regno);
#endif
		  first_regno = regno;
		  while (val & (1 << (regno + 1)))
		    ++regno;
		  if (regno > first_regno)
#ifdef MOTOROLA
		    (*info->fprintf_func) (info->stream, "-fp%d", regno);
#else
		    (*info->fprintf_func) (info->stream, "-%%fp%d", regno);
#endif
		}
	  }
	else if (place == '8')
	  {
	    FETCH_ARG (3, val);
	    /* fmoveml for FP status registers.  */
	    (*info->fprintf_func) (info->stream, "%s", fpcr_names[val]);
	  }
	else
	  return PRINT_INSN_ARG_INVALID_OP_TABLE;
      break;

    case 'X':
      place = '8';
      /* Fall through.  */
    case 'Y':
    case 'Z':
    case 'W':
    case '0':
    case '1':
    case '2':
    case '3':
      {
	char *name = 0;

	FETCH_ARG (5, val);
	switch (val)
	  {
#ifdef MOTOROLA
	  case 2: name = "tt0"; break;
	  case 3: name = "tt1"; break;
	  case 0x10: name = "tc"; break;
	  case 0x11: name = "drp"; break;
	  case 0x12: name = "srp"; break;
	  case 0x13: name = "crp"; break;
	  case 0x14: name = "cal"; break;
	  case 0x15: name = "val"; break;
	  case 0x16: name = "scc"; break;
	  case 0x17: name = "ac"; break;
 	  case 0x18: name = "psr"; break;
	  case 0x19: name = "pcsr"; break;
	  case 0x1c:
	  case 0x1d:
	    {
	      int break_reg = ((buffer[3] >> 2) & 7);

	      (*info->fprintf_func)
		(info->stream, val == 0x1c ? "bad%d" : "bac%d",
		 break_reg);
	    }
#else
	  case 2: name = "%tt0"; break;
	  case 3: name = "%tt1"; break;
	  case 0x10: name = "%tc"; break;
	  case 0x11: name = "%drp"; break;
	  case 0x12: name = "%srp"; break;
	  case 0x13: name = "%crp"; break;
	  case 0x14: name = "%cal"; break;
	  case 0x15: name = "%val"; break;
	  case 0x16: name = "%scc"; break;
	  case 0x17: name = "%ac"; break;
 	  case 0x18: name = "%psr"; break;
	  case 0x19: name = "%pcsr"; break;
	  case 0x1c:
	  case 0x1d:
	    {
	      int break_reg = ((buffer[3] >> 2) & 7);

	      (*info->fprintf_func)
		(info->stream, val == 0x1c ? "%%bad%d" : "%%bac%d",
		 break_reg);
	    }
#endif
	    break;
	  default:
	    (*info->fprintf_func) (info->stream, "<mmu register %d>", val);
	  }
	if (name)
	  (*info->fprintf_func) (info->stream, "%s", name);
      }
      break;

    case 'f':
      {
	int fc;

	FETCH_ARG (5, fc);
	if (fc == 1)
#ifdef MOTOROLA
	  (*info->fprintf_func) (info->stream, "dfc");
	else if (fc == 0)
	  (*info->fprintf_func) (info->stream, "sfc");
#else
	  (*info->fprintf_func) (info->stream, "%%dfc");
	else if (fc == 0)
	  (*info->fprintf_func) (info->stream, "%%sfc");
#endif
	else
	  /* xgettext:c-format */
	  (*info->fprintf_func) (info->stream, _("<function code %d>"), fc);
      }
      break;

    case 'V':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "val");
#else
      (*info->fprintf_func) (info->stream, "%%val");
#endif
      break;

    case 't':
      {
	int level;

	FETCH_ARG (3, level);
	(*info->fprintf_func) (info->stream, "%d", level);
      }
      break;

    case 'u':
      {
	short is_upper = 0;
	int reg;

	FETCH_ARG (5, reg);
	if (reg & 0x10)
	  {
	    is_upper = 1;
	    reg &= 0xf;
	  }
	(*info->fprintf_func) (info->stream, "%s%s",
			       reg_half_names[reg],
			       is_upper ? "u" : "l");
      }
      break;

    default:
      return PRINT_INSN_ARG_INVALID_OP_TABLE;
    }

  return p - p0;
}